

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

char * archive_read_disk_gname(archive *_a,int64_t gid)

{
  int iVar1;
  archive_read_disk *a;
  int64_t gid_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_gname");
  if (iVar1 == 0) {
    if (_a[1].error == (char *)0x0) {
      _a_local = (archive *)0x0;
    }
    else {
      _a_local = (archive *)(*(code *)_a[1].error)(_a[1].error_string.length,gid);
    }
  }
  else {
    _a_local = (archive *)0x0;
  }
  return (char *)_a_local;
}

Assistant:

const char *
archive_read_disk_gname(struct archive *_a, int64_t gid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_gname"))
		return (NULL);
	if (a->lookup_gname == NULL)
		return (NULL);
	return ((*a->lookup_gname)(a->lookup_gname_data, gid));
}